

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O2

void DoDamage(AActor *dmgtarget,AActor *inflictor,AActor *source,int amount,FName *DamageType,
             int flags,PClassActor *filter,FName *species)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  DAngle angle;
  FName local_40;
  FName local_3c;
  undefined8 local_38;
  
  bVar2 = DoCheckClass(dmgtarget,filter,SUB41((flags & 0x40U) >> 6,0));
  local_3c = (FName)species->Index;
  bVar3 = DoCheckSpecies(dmgtarget,&local_3c,(bool)((byte)((uint)flags >> 7) & 1));
  if (((uint)flags >> 8 & 1) == 0) {
    if (!bVar2 || !bVar3) {
      return;
    }
  }
  else if (!bVar2 && !bVar3) {
    return;
  }
  iVar4 = (flags & 1U) * 0x40;
  iVar1 = iVar4 + 0x10;
  if ((flags & 0xcU) == 0) {
    iVar1 = iVar4;
  }
  if ((flags & 4U) != 0) {
    amount = amount + dmgtarget->health;
  }
  if (amount < 1) {
    if (amount < 0) {
      P_GiveBody(dmgtarget,-amount,0);
      return;
    }
  }
  else {
    if (((uint)flags >> 9 & 1) == 0) {
      local_40 = (FName)DamageType->Index;
    }
    else {
      local_40.Index = (inflictor->DamageType).super_FName.Index;
      DamageType->Index = (int)local_40;
    }
    local_38 = 0;
    P_DamageMobj(dmgtarget,inflictor,source,amount,&local_40,
                 flags * 8 & 0x100U | (uint)((flags & 6U) != 2) | iVar1 + (flags * 8 & 0x80U),angle)
    ;
  }
  return;
}

Assistant:

static void DoDamage(AActor *dmgtarget, AActor *inflictor, AActor *source, int amount, FName DamageType, int flags, PClassActor *filter, FName species)
{
	bool filterpass = DoCheckClass(dmgtarget, filter, !!(flags & DMSS_EXFILTER)),
		speciespass = DoCheckSpecies(dmgtarget, species, !!(flags & DMSS_EXSPECIES));
	if ((flags & DMSS_EITHER) ? (filterpass || speciespass) : (filterpass && speciespass))
	{
		int dmgFlags = 0;
		if (flags & DMSS_FOILINVUL)
			dmgFlags |= DMG_FOILINVUL;
		if (flags & DMSS_FOILBUDDHA)
			dmgFlags |= DMG_FOILBUDDHA;
		if (flags & (DMSS_KILL | DMSS_NOFACTOR)) //Kill implies NoFactor
			dmgFlags |= DMG_NO_FACTOR;
		if (!(flags & DMSS_AFFECTARMOR) || (flags & DMSS_KILL)) //Kill overrides AffectArmor
			dmgFlags |= DMG_NO_ARMOR;
		if (flags & DMSS_KILL) //Kill adds the value of the damage done to it. Allows for more controlled extreme death types.
			amount += dmgtarget->health;
		if (flags & DMSS_NOPROTECT) //Ignore PowerProtection.
			dmgFlags |= DMG_NO_PROTECT;
	
		if (amount > 0)
		{ //Should wind up passing them through just fine.
			if (flags & DMSS_INFLICTORDMGTYPE)
				DamageType = inflictor->DamageType;

			P_DamageMobj(dmgtarget, inflictor, source, amount, DamageType, dmgFlags);
		}
		else if (amount < 0)
		{
			amount = -amount;
			P_GiveBody(dmgtarget, amount);
		}
	}
}